

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O2

bool __thiscall IntVarSL::remVal(IntVarSL *this,int64_t v,Reason r,bool channel)

{
  int iVar1;
  undefined7 in_register_00000009;
  
  iVar1 = find_index(this,(int)v,ROUND_NONE);
  iVar1 = (*(this->el->super_IntVar).super_Var.super_Branching._vptr_Branching[0x11])
                    (this->el,(long)iVar1,r.field_0,
                     CONCAT71(in_register_00000009,channel) & 0xffffffff);
  if (SUB41(iVar1,0) != false) {
    Tchar::operator=((this->super_IntVar).vals + v,'\0');
    Tint::operator=(&(this->super_IntVar).min,
                    (this->values).data[(uint)(this->el->super_IntVar).min.v]);
    Tint::operator=(&(this->super_IntVar).max,
                    (this->values).data[(uint)(this->el->super_IntVar).max.v]);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool IntVarSL::remVal(int64_t v, Reason r, bool channel) {
	assert(remValNotR(v));
	const int u = find_index(static_cast<int>(v), ROUND_NONE);
	assert(u != -1);
	if (!el->remVal(u, r, channel)) {
		return false;
	}
	vals[v] = 0;
	min = values[el->min];
	max = values[el->max];
	return true;
}